

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

Error * ot::commissioner::CommissionerImpl::EncodePendingOperationalDataset
                  (Error *__return_storage_ptr__,Request *aRequest,
                  PendingOperationalDataset *aDataset)

{
  string *this;
  ErrorCode EVar1;
  uint64_t aValue;
  Tlv local_78;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  char local_40 [16];
  
  __return_storage_ptr__->mCode = kNone;
  this = &__return_storage_ptr__->mMessage;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  EncodeActiveOperationalDataset
            ((Error *)local_58,aRequest,&aDataset->super_ActiveOperationalDataset);
  __return_storage_ptr__->mCode = local_58._0_4_;
  std::__cxx11::string::operator=((string *)this,(string *)&local_50);
  EVar1 = __return_storage_ptr__->mCode;
  if (local_50._M_p != local_40) {
    operator_delete(local_50._M_p);
  }
  if (EVar1 == kNone) {
    if (((aDataset->super_ActiveOperationalDataset).mPresentFlags & 0x20) != 0) {
      tlv::Tlv::Tlv(&local_78,kDelayTimer,
                    *(uint32_t *)&(aDataset->super_ActiveOperationalDataset).field_0xd4,kMeshCoP);
      AppendTlv((Error *)local_58,aRequest,&local_78);
      __return_storage_ptr__->mCode = local_58._0_4_;
      std::__cxx11::string::operator=((string *)this,(string *)&local_50);
      EVar1 = __return_storage_ptr__->mCode;
      if (local_50._M_p != local_40) {
        operator_delete(local_50._M_p);
      }
      if (local_78.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.mValue.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (EVar1 != kNone) {
        return __return_storage_ptr__;
      }
    }
    if (((aDataset->super_ActiveOperationalDataset).mPresentFlags & 0x10) != 0) {
      aValue = Timestamp::Encode(&aDataset->mPendingTimestamp);
      tlv::Tlv::Tlv(&local_78,kPendingTimestamp,aValue,kMeshCoP);
      AppendTlv((Error *)local_58,aRequest,&local_78);
      __return_storage_ptr__->mCode = local_58._0_4_;
      std::__cxx11::string::operator=((string *)this,(string *)&local_50);
      if (local_50._M_p != local_40) {
        operator_delete(local_50._M_p);
      }
      if (local_78.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.mValue.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::EncodePendingOperationalDataset(coap::Request                   &aRequest,
                                                        const PendingOperationalDataset &aDataset)
{
    Error error;

    SuccessOrExit(error = EncodeActiveOperationalDataset(aRequest, aDataset));

    if (aDataset.mPresentFlags & PendingOperationalDataset::kDelayTimerBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kDelayTimer, aDataset.mDelayTimer}));
    }

    if (aDataset.mPresentFlags & PendingOperationalDataset::kPendingTimestampBit)
    {
        SuccessOrExit(error = AppendTlv(aRequest, {tlv::Type::kPendingTimestamp, aDataset.mPendingTimestamp.Encode()}));
    }

exit:
    return error;
}